

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

enum_<kratos::StatementBlockType> * __thiscall
pybind11::enum_<kratos::StatementBlockType>::value
          (enum_<kratos::StatementBlockType> *this,char *name,StatementBlockType value,char *doc)

{
  StatementBlockType local_34;
  handle hStack_30;
  StatementBlockType value_local;
  
  local_34 = value;
  hStack_30 = pybind11::detail::type_caster_base<kratos::StatementBlockType>::cast
                        (&local_34,copy,(handle)0x0);
  pybind11::detail::enum_base::value(&this->m_base,name,(object *)&stack0xffffffffffffffd0,doc);
  object::~object((object *)&stack0xffffffffffffffd0);
  return this;
}

Assistant:

enum_& value(char const* name, Type value, const char *doc = nullptr) {
        m_base.value(name, pybind11::cast(value, return_value_policy::copy), doc);
        return *this;
    }